

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O0

int update_state(test_state *state)

{
  aec_stream *paVar1;
  aec_stream *strm;
  test_state *state_local;
  
  paVar1 = state->strm;
  if (paVar1->bits_per_sample < 0x11) {
    if (paVar1->bits_per_sample < 9) {
      state->id_len = 3;
      state->bytes_per_sample = 1;
    }
    else {
      state->id_len = 4;
      state->bytes_per_sample = 2;
    }
  }
  else {
    state->id_len = 5;
    if ((paVar1->bits_per_sample < 0x19) && ((paVar1->flags & 2) != 0)) {
      state->bytes_per_sample = 3;
    }
    else {
      state->bytes_per_sample = 4;
    }
  }
  if ((paVar1->flags & 4) == 0) {
    state->out = out_lsb;
  }
  else {
    state->out = out_msb;
  }
  if ((paVar1->flags & 1) == 0) {
    state->xmin = 0;
    state->xmax = (1L << ((byte)paVar1->bits_per_sample & 0x3f)) + -1;
  }
  else {
    state->xmin = -(1L << ((char)paVar1->bits_per_sample - 1U & 0x3f));
    state->xmax = (1L << ((char)paVar1->bits_per_sample - 1U & 0x3f)) + -1;
  }
  return 0;
}

Assistant:

int update_state(struct test_state *state)
{
    struct aec_stream *strm = state->strm;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
        } else {
            state->bytes_per_sample = 4;
        }
    }
    else if (strm->bits_per_sample > 8) {
        state->id_len = 4;
        state->bytes_per_sample = 2;
    } else {
        state->id_len = 3;
        state->bytes_per_sample = 1;
    }

    if (strm->flags & AEC_DATA_MSB)
        state->out = out_msb;
    else
        state->out = out_lsb;

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmin = -(1LL << (strm->bits_per_sample - 1));
        state->xmax = (1ULL << (strm->bits_per_sample - 1)) - 1;
    } else {
        state->xmin = 0;
        state->xmax = (1ULL << strm->bits_per_sample) - 1;
    }

    return 0;
}